

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O3

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  __uid_t __uid;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  char *first;
  bool bVar8;
  char cVar9;
  bool bVar10;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  int local_10ac;
  int local_10a4;
  char *local_1098;
  passwd *local_1070;
  passwd local_1068;
  char local_1038 [4104];
  
  first = *loginp;
  if (first == (char *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = *first != '\0';
  }
  local_1098 = *passwordp;
  if (netrcfile == (char *)0x0) {
    pcVar7 = curl_getenv("HOME");
    if (pcVar7 == (char *)0x0) {
      __uid = geteuid();
      iVar5 = getpwuid_r(__uid,&local_1068,local_1038,0x400,&local_1070);
      if (iVar5 != 0) {
        return 1;
      }
      if (local_1070 == (passwd *)0x0) {
        return 1;
      }
      pcVar7 = (*Curl_cstrdup)(local_1068.pw_dir);
      if (pcVar7 == (char *)0x0) {
        return 0x1b;
      }
    }
    pcVar6 = curl_maprintf("%s%s%s",pcVar7,"/",".netrc");
    (*Curl_cfree)(pcVar7);
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
    __stream = fopen64(pcVar6,"r");
    (*Curl_cfree)(pcVar6);
  }
  else {
    __stream = fopen64(netrcfile,"r");
  }
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  local_10a4 = 1;
  local_10ac = 0;
  bVar2 = false;
  bVar3 = false;
  cVar9 = '\0';
  bVar4 = false;
  bVar8 = false;
LAB_00129af9:
  do {
    pcVar7 = fgets(local_1038,0x1000,__stream);
    if (pcVar7 == (char *)0x0) goto LAB_00129d82;
    pcVar7 = strtok_r(local_1038," \t\n",&local_1068.pw_name);
    if (pcVar7 == (char *)0x0) {
      bVar1 = false;
    }
    else {
      if (*pcVar7 == '#') goto LAB_00129af9;
      do {
        if (((first != (char *)0x0) && (local_1098 != (char *)0x0 && *first != '\0')) &&
           (*local_1098 != '\0')) {
          bVar1 = true;
          break;
        }
        if (cVar9 == '\x02') {
          if (bVar3) {
            if (bVar10) {
              local_10ac = Curl_strcasecompare(first,pcVar7);
              cVar9 = '\x02';
              bVar3 = false;
            }
            else {
              if (bVar8) {
                (*Curl_cfree)(first);
                bVar8 = false;
              }
              first = (*Curl_cstrdup)(pcVar7);
              bVar3 = false;
              if (first == (char *)0x0) {
                local_10a4 = -1;
                first = (char *)0x0;
                goto LAB_00129d95;
              }
              cVar9 = '\x02';
              bVar8 = true;
            }
          }
          else {
            if (bVar2) {
              cVar9 = '\x02';
              if ((bool)(bVar10 & local_10ac == 0)) {
                bVar3 = false;
                bVar2 = false;
                local_10ac = 0;
                goto LAB_00129d48;
              }
              if (bVar4) {
                (*Curl_cfree)(local_1098);
                bVar4 = false;
              }
              local_1098 = (*Curl_cstrdup)(pcVar7);
              if (local_1098 == (char *)0x0) {
                local_10a4 = -1;
                local_1098 = (char *)0x0;
                goto LAB_00129d95;
              }
              bVar3 = false;
              bVar4 = true;
            }
            else {
              iVar5 = Curl_strcasecompare("login",pcVar7);
              cVar9 = '\x02';
              if (iVar5 == 0) {
                iVar5 = Curl_strcasecompare("password",pcVar7);
                if (iVar5 != 0) {
                  bVar3 = false;
                  bVar2 = true;
                  goto LAB_00129d48;
                }
                iVar5 = Curl_strcasecompare("machine",pcVar7);
                bVar3 = false;
                if (iVar5 != 0) {
                  local_10ac = 0;
                }
                cVar9 = (iVar5 == 0) + '\x01';
              }
              else {
                bVar3 = true;
              }
            }
            bVar2 = false;
          }
        }
        else {
          pcVar6 = host;
          if (cVar9 != '\x01') {
            iVar5 = Curl_strcasecompare("machine",pcVar7);
            cVar9 = '\x01';
            if (iVar5 != 0) goto LAB_00129d48;
            pcVar6 = "default";
          }
          iVar5 = Curl_strcasecompare(pcVar6,pcVar7);
          if (iVar5 != 0) {
            local_10a4 = 0;
          }
          cVar9 = (iVar5 != 0) * '\x02';
        }
LAB_00129d48:
        bVar1 = false;
        pcVar7 = strtok_r((char *)0x0," \t\n",&local_1068.pw_name);
      } while (pcVar7 != (char *)0x0);
    }
    if (bVar1) {
LAB_00129d82:
      if (local_10a4 == 0) {
        if (bVar8) {
          if (*loginp != (char *)0x0) {
            (*Curl_cfree)(*loginp);
          }
          *loginp = first;
        }
        local_10a4 = 0;
        if (bVar4) {
          if (*passwordp != (char *)0x0) {
            (*Curl_cfree)(*passwordp);
          }
          *passwordp = local_1098;
          local_10a4 = 0;
        }
      }
      else {
LAB_00129d95:
        if (bVar8) {
          (*Curl_cfree)(first);
        }
        if (bVar4) {
          (*Curl_cfree)(local_1098);
        }
      }
      fclose(__stream);
      return local_10a4;
    }
  } while( true );
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode = 1;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  bool netrc_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(!done && tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = 0; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = -1; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}